

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall cs::extension::extension(extension *this,string *path)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  dll *this_00;
  code *pcVar4;
  runtime_error *prVar5;
  __off_t __length;
  __off_t __length_00;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  name_space::name_space(&this->super_name_space);
  (this->super_name_space)._vptr_name_space = (_func_int **)&PTR__name_space_00249e58;
  this_00 = (dll *)operator_new(8);
  cov::dll::dll(this_00,path);
  garbage_collector<cov::dll>::add((garbage_collector<cov::dll> *)&gc,this_00);
  std::__cxx11::string::string((string *)&local_e0,"__CS_ABI_COMPATIBLE__",(allocator *)&local_c0);
  pcVar4 = (code *)cov::dll::get_address(this_00,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (pcVar4 != (code *)0x0) {
    uVar1 = (*pcVar4)();
    iVar2 = truncate((extension *)(ulong)uVar1,(char *)0x4,__length);
    iVar3 = truncate((extension *)0x383a4,(char *)0x4,__length_00);
    if (iVar2 == iVar3) {
      std::__cxx11::string::string
                ((string *)&local_e0,"__CS_EXTENSION_MAIN__",(allocator *)&local_c0);
      pcVar4 = (code *)cov::dll::get_address(this_00,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(this,current_process);
        return;
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_e0,"Broken Covariant Script Extension.",(allocator *)&local_c0);
      runtime_error::runtime_error(prVar5,&local_e0);
      __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
  iVar2 = (*pcVar4)();
  std::__cxx11::to_string(&local_80,iVar2);
  std::operator+(&local_60,"Incompatible Covariant Script Extension.(Target: ",&local_80);
  std::operator+(&local_40,&local_60,", Current: ");
  std::__cxx11::to_string(&local_a0,0x383a4);
  std::operator+(&local_c0,&local_40,&local_a0);
  std::operator+(&local_e0,&local_c0,")");
  runtime_error::runtime_error(prVar5,&local_e0);
  __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

explicit extension(const std::string &path)
		{
			using namespace dll_resources;
			cov::dll *dll = new cov::dll(path);
			gc.add(dll);
			dll_compatible_check_t dll_check = reinterpret_cast<dll_compatible_check_t>(dll->get_address(
			                                       dll_compatible_check));
			if (dll_check == nullptr || truncate(dll_check(), 4) != truncate(COVSCRIPT_ABI_VERSION, 4))
				throw runtime_error("Incompatible Covariant Script Extension.(Target: " + std::to_string(dll_check()) +
				                    ", Current: " + std::to_string(COVSCRIPT_ABI_VERSION) + ")");
			dll_main_entrance_t dll_main = reinterpret_cast<dll_main_entrance_t>(dll->get_address(dll_main_entrance));
			if (dll_main != nullptr) {
				dll_main(this, current_process);
			}
			else
				throw runtime_error("Broken Covariant Script Extension.");
		}